

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O0

bool __thiscall ninx::lexer::Reader::ignore_comment(Reader *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int current;
  bool is_closing;
  Reader *this_local;
  
  iVar3 = std::istream::peek();
  if (iVar3 == 0x2f) {
    std::istream::get();
    iVar3 = std::istream::peek();
    if (iVar3 == 0x2a) {
      std::istream::get();
      bVar1 = false;
      while (bVar2 = std::ios::operator_cast_to_bool
                               ((ios *)(this->stream + *(long *)(*(long *)this->stream + -0x18))),
            bVar2) {
        iVar3 = std::istream::get();
        if (bVar1) {
          if (iVar3 == 0x2f) break;
          bVar1 = false;
        }
        else if (iVar3 == 0x2a) {
          bVar1 = true;
        }
      }
      ignore_spaces_and_newline(this);
      this_local._7_1_ = true;
    }
    else {
      std::istream::seekg((long)this->stream,~_S_beg);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ninx::lexer::Reader::ignore_comment() {
    // Verify that this is a comment
    if (this->stream.peek() != '/') {
        return false;  // Not a comment
    }

    this->stream.get();

    if (this->stream.peek() != '*') {
        this->stream.seekg(-1, std::ios_base::cur);  // Rewind the / character
        return false;
    }

    this->stream.get();

    bool is_closing {false};

    while (stream) {
        int current {stream.get()};

        if (is_closing) {
            if (current == '/') {
                break;
            }else{
                is_closing = false;
            }
        }else{
            if (current == '*') {
                is_closing = true;
            }
        }
    }

    // Eat all the following spaces
    this->ignore_spaces_and_newline();

    return true;
}